

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testString.cxx
# Opt level: O1

bool testMethod_substr_AtEnd(String *str)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  string *psVar4;
  ostream *poVar5;
  char *pcVar6;
  String substr;
  String local_30;
  
  cm::String::substr(&local_30,str,1,0xffffffffffffffff);
  if (local_30.view_._M_str == (str->view_)._M_str + 1) {
    if (local_30.view_._M_len == 2) {
      bVar1 = cm::String::is_stable(&local_30);
      if (bVar1) {
        iVar2 = 0x30c;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"ASSERT_TRUE(!substr.is_stable()) failed on line ",0x30);
      }
      else {
        pcVar3 = cm::String::c_str(&local_30);
        iVar2 = strcmp(pcVar3,"bc");
        if (iVar2 == 0) {
          pcVar3 = cm::String::c_str(&local_30);
          pcVar6 = (str->view_)._M_str + 1;
          if (pcVar3 == pcVar6) {
            if (local_30.view_._M_str == pcVar6) {
              if (local_30.view_._M_len == 2) {
                bVar1 = cm::String::is_stable(&local_30);
                if (bVar1) {
                  iVar2 = 0x313;
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,
                             "ASSERT_TRUE(!substr.is_stable()) failed on line ",0x30);
                }
                else {
                  psVar4 = cm::String::str_abi_cxx11_(&local_30);
                  iVar2 = std::__cxx11::string::compare((char *)psVar4);
                  if (iVar2 == 0) {
                    bVar1 = cm::String::is_stable(&local_30);
                    if (bVar1) {
                      if (local_30.view_._M_str == (str->view_)._M_str + 1) {
                        iVar2 = 0x318;
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cout,
                                   "ASSERT_TRUE(substr.data() != str.data() + 1) failed on line ",
                                   0x3c);
                      }
                      else if (local_30.view_._M_len == 2) {
                        pcVar3 = cm::String::c_str(&local_30);
                        if (pcVar3 == (str->view_)._M_str + 1) {
                          iVar2 = 0x31a;
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cout,
                                     "ASSERT_TRUE(substr.c_str() != str.data() + 1) failed on line "
                                     ,0x3d);
                        }
                        else {
                          pcVar3 = cm::String::c_str(&local_30);
                          iVar2 = strcmp(pcVar3,"bc");
                          if (iVar2 == 0) {
                            bVar1 = true;
                            goto LAB_0018f864;
                          }
                          iVar2 = 0x31b;
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cout,
                                     "ASSERT_TRUE(std::strcmp(substr.c_str(), \"bc\") == 0) failed on line "
                                     ,0x43);
                        }
                      }
                      else {
                        iVar2 = 0x319;
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cout,
                                   "ASSERT_TRUE(substr.size() == 2) failed on line ",0x2f);
                      }
                    }
                    else {
                      iVar2 = 0x317;
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,
                                 "ASSERT_TRUE(substr.is_stable()) failed on line ",0x2f);
                    }
                  }
                  else {
                    iVar2 = 0x316;
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,
                               "ASSERT_TRUE(substr.str() == \"bc\") failed on line ",0x31);
                  }
                }
              }
              else {
                iVar2 = 0x312;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"ASSERT_TRUE(substr.size() == 2) failed on line ",
                           0x2f);
              }
            }
            else {
              iVar2 = 0x311;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,
                         "ASSERT_TRUE(substr.data() == str.data() + 1) failed on line ",0x3c);
            }
          }
          else {
            iVar2 = 0x310;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,
                       "ASSERT_TRUE(substr.c_str() == str.data() + 1) failed on line ",0x3d);
          }
        }
        else {
          iVar2 = 0x30f;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,
                     "ASSERT_TRUE(std::strcmp(substr.c_str(), \"bc\") == 0) failed on line ",0x43);
        }
      }
    }
    else {
      iVar2 = 0x30b;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"ASSERT_TRUE(substr.size() == 2) failed on line ",0x2f);
    }
  }
  else {
    iVar2 = 0x30a;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"ASSERT_TRUE(substr.data() == str.data() + 1) failed on line ",
               0x3c);
  }
  poVar5 = (ostream *)std::ostream::operator<<(&std::cout,iVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
  bVar1 = false;
LAB_0018f864:
  if (local_30.string_.
      super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_30.string_.
               super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return bVar1;
}

Assistant:

static bool testMethod_substr_AtEnd(cm::String str)
{
  cm::String substr = str.substr(1);
  ASSERT_TRUE(substr.data() == str.data() + 1);
  ASSERT_TRUE(substr.size() == 2);
  ASSERT_TRUE(!substr.is_stable());

  // c_str() at the end of the buffer does not internally mutate.
  ASSERT_TRUE(std::strcmp(substr.c_str(), "bc") == 0);
  ASSERT_TRUE(substr.c_str() == str.data() + 1);
  ASSERT_TRUE(substr.data() == str.data() + 1);
  ASSERT_TRUE(substr.size() == 2);
  ASSERT_TRUE(!substr.is_stable());

  // str() internally mutates.
  ASSERT_TRUE(substr.str() == "bc");
  ASSERT_TRUE(substr.is_stable());
  ASSERT_TRUE(substr.data() != str.data() + 1);
  ASSERT_TRUE(substr.size() == 2);
  ASSERT_TRUE(substr.c_str() != str.data() + 1);
  ASSERT_TRUE(std::strcmp(substr.c_str(), "bc") == 0);
  return true;
}